

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-kalman-filter.cpp
# Opt level: O0

MeasureVector __thiscall
stateObservation::LinearKalmanFilter::simulateSensor_
          (LinearKalmanFilter *this,StateVector *x,uint k)

{
  bool bVar1;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  uint in_ECX;
  undefined4 in_register_00000014;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar2;
  MeasureVector MVar3;
  bool local_d2;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_b0;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_a0;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_90;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  local_80;
  byte local_41;
  Matrix<double,__1,__1,_0,__1,__1> local_40;
  uint local_24;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pMStack_20;
  uint k_local;
  StateVector *x_local;
  LinearKalmanFilter *this_local;
  
  pMStack_20 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               CONCAT44(in_register_00000014,k);
  local_24 = in_ECX;
  x_local = x;
  this_local = this;
  bVar1 = KalmanFilterBase::checkCmatrix((KalmanFilterBase *)x,(Cmatrix *)(x + 0x10));
  if (!bVar1) {
    __assert_fail("checkCmatrix(c_) && \"ERROR: The C is not initialized\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/linear-kalman-filter.cpp"
                  ,0x39,
                  "virtual ObserverBase::MeasureVector stateObservation::LinearKalmanFilter::simulateSensor_(const StateVector &, unsigned int)"
                 );
  }
  bVar1 = checkDmatrix((LinearKalmanFilter *)x,
                       (Dmatrix *)
                       &x[0x26].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows);
  if (bVar1) {
    local_41 = 0;
    local_d2 = false;
    if (*(int *)&x[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data != 0) {
      getDmatrixZero((Dmatrix *)&local_40,(LinearKalmanFilter *)x);
      local_41 = 1;
      local_d2 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator!=
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                            &x[0x26].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,
                            (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_40);
    }
    if ((local_41 & 1) != 0) {
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_40);
    }
    if (local_d2 == false) {
      local_b0 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(x + 0x10),pMStack_20
                           );
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((Matrix<double,_1,1,0,_1,1> *)this,&local_b0);
      IVar2 = extraout_RDX_00;
    }
    else {
      bVar1 = IndexedMatrixArray::checkIndex((IndexedMatrixArray *)(x + 9),local_24);
      if (!bVar1) {
        __assert_fail("u_.checkIndex(k) && \"ERROR: The input feedthrough of the measurements is not set                              (the measurement at time k needs the input at time k which was not given)                              if you don\'t need the input in the computation of measurement, you                              must set D matrix to zero\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/linear-kalman-filter.cpp"
                      ,0x42,
                      "virtual ObserverBase::MeasureVector stateObservation::LinearKalmanFilter::simulateSensor_(const StateVector &, unsigned int)"
                     );
      }
      local_90 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(x + 0x10),pMStack_20
                           );
      other = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              IndexedMatrixArray::operator[]((IndexedMatrixArray *)(x + 9),local_24);
      local_a0 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                            &x[0x26].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,other);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
      ::operator+(&local_80,
                  (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                   *)&local_90,
                  (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                   *)&local_a0);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>>
                ((Matrix<double,_1,1,0,_1,1> *)this,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>
                  *)&local_80);
      IVar2 = extraout_RDX;
    }
    MVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar2;
    MVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (MeasureVector)
           MVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  __assert_fail("checkDmatrix(d_) && \"ERROR: The D is not initialized\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/linear-kalman-filter.cpp"
                ,0x3a,
                "virtual ObserverBase::MeasureVector stateObservation::LinearKalmanFilter::simulateSensor_(const StateVector &, unsigned int)"
               );
}

Assistant:

ObserverBase::MeasureVector LinearKalmanFilter::simulateSensor_(const StateVector& x, unsigned k)
    {

        BOOST_ASSERT(checkCmatrix(c_) && "ERROR: The C is not initialized");
        BOOST_ASSERT(checkDmatrix(d_) && "ERROR: The D is not initialized");

        if (p_>0 && d_!=getDmatrixZero())
        {
                BOOST_ASSERT(u_.checkIndex(k) &&
                             "ERROR: The input feedthrough of the measurements is not set \
                             (the measurement at time k needs the input at time k which was not given) \
                             if you don't need the input in the computation of measurement, you \
                             must set D matrix to zero");
                return c_*x+d_*u_[k];

        }
        else
        {
            return ObserverBase::MeasureVector(c_*x);
        }

    }